

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgga.c
# Opt level: O1

void xc_mgga_sanity_check(xc_func_info_type *info,int order,xc_mgga_out_params *out)

{
  long lVar1;
  uint uVar2;
  undefined8 *extraout_RDX;
  long lVar3;
  undefined4 in_register_00000034;
  
  lVar3 = CONCAT44(in_register_00000034,order);
  if ((uint)order < 5) {
    if ((out->zk != (double *)0x0) && ((info->flags & 1) == 0)) goto LAB_007feb47;
    if (out->vrho != (double *)0x0) {
      uVar2 = info->flags;
      if ((uVar2 & 2) == 0) goto LAB_007feb4c;
      if (out->vsigma == (double *)0x0) goto LAB_007feb51;
      if (((short)uVar2 < 0) && (out->vlapl == (double *)0x0)) goto LAB_007feb92;
      if (((uVar2 >> 0x10 & 1) == 0) || (out->vtau != (double *)0x0)) goto LAB_007fe768;
      goto LAB_007feb97;
    }
LAB_007fe768:
    if (out->v2rho2 != (double *)0x0) {
      uVar2 = info->flags;
      if ((uVar2 & 4) == 0) goto LAB_007feb56;
      if (out->v2rhosigma == (double *)0x0) goto LAB_007feb5b;
      if (out->v2sigma2 == (double *)0x0) goto LAB_007feb60;
      if ((short)uVar2 < 0) {
        if (out->v2rholapl == (double *)0x0) goto LAB_007feb9c;
        if (out->v2sigmalapl == (double *)0x0) goto LAB_007feba1;
        if (out->v2lapl2 != (double *)0x0) goto LAB_007fe7ba;
        goto LAB_007febab;
      }
LAB_007fe7ba:
      if ((uVar2 >> 0x10 & 1) == 0) {
LAB_007fe7e1:
        if (((~uVar2 & 0x18000) != 0) || (out->v2lapltau != (double *)0x0)) goto LAB_007fe7f5;
        goto LAB_007febb5;
      }
      if (out->v2rhotau == (double *)0x0) goto LAB_007feba6;
      if (out->v2sigmatau == (double *)0x0) goto LAB_007febb0;
      if (out->v2tau2 != (double *)0x0) goto LAB_007fe7e1;
      goto LAB_007febba;
    }
LAB_007fe7f5:
    if (out->v3rho3 == (double *)0x0) goto LAB_007fe929;
    uVar2 = info->flags;
    if ((uVar2 & 8) == 0) goto LAB_007feb65;
    if (out->v3rho2sigma == (double *)0x0) goto LAB_007feb6a;
    if (out->v3rhosigma2 == (double *)0x0) goto LAB_007feb6f;
    if (out->v3sigma3 == (double *)0x0) goto LAB_007feb74;
    if ((short)uVar2 < 0) {
      if (out->v3rho2lapl == (double *)0x0) goto LAB_007febbf;
      if (out->v3rhosigmalapl == (double *)0x0) goto LAB_007febc4;
      if (out->v3rholapl2 == (double *)0x0) goto LAB_007febc9;
      if (out->v3sigma2lapl == (double *)0x0) goto LAB_007febce;
      if (out->v3sigmalapl2 == (double *)0x0) goto LAB_007febd8;
      if (out->v3lapl3 != (double *)0x0) goto LAB_007fe88e;
      goto LAB_007febe2;
    }
LAB_007fe88e:
    if ((uVar2 >> 0x10 & 1) != 0) {
      if (out->v3rho2tau == (double *)0x0) goto LAB_007febd3;
      if (out->v3rhosigmatau == (double *)0x0) goto LAB_007febdd;
      if (out->v3rhotau2 == (double *)0x0) goto LAB_007febe7;
      if (out->v3sigma2tau == (double *)0x0) goto LAB_007febec;
      if (out->v3sigmatau2 == (double *)0x0) goto LAB_007febf6;
      if (out->v3tau3 != (double *)0x0) goto LAB_007fe8e8;
      goto LAB_007fec00;
    }
LAB_007fe8e8:
    if ((~uVar2 & 0x18000) == 0) {
      if (out->v3rholapltau == (double *)0x0) goto LAB_007febf1;
      if (out->v3sigmalapltau == (double *)0x0) goto LAB_007febfb;
      if (out->v3lapl2tau == (double *)0x0) goto LAB_007fec05;
      if (out->v3lapltau2 != (double *)0x0) goto LAB_007fe929;
      goto LAB_007fec0f;
    }
LAB_007fe929:
    if (out->v4rho4 == (double *)0x0) {
      return;
    }
    uVar2 = info->flags;
    if ((uVar2 & 0x10) == 0) goto LAB_007feb79;
    if (out->v4rho3sigma == (double *)0x0) goto LAB_007feb7e;
    if (out->v4rho2sigma2 == (double *)0x0) goto LAB_007feb83;
    if (out->v4rhosigma3 == (double *)0x0) goto LAB_007feb88;
    if (out->v4sigma4 == (double *)0x0) goto LAB_007feb8d;
    if ((short)uVar2 < 0) {
      if (out->v4rho3lapl == (double *)0x0) goto LAB_007fec0a;
      if (out->v4rho2sigmalapl == (double *)0x0) goto LAB_007fec14;
      if (out->v4rho2lapl2 == (double *)0x0) goto LAB_007fec19;
      if (out->v4rhosigma2lapl == (double *)0x0) goto LAB_007fec1e;
      if (out->v4rhosigmalapl2 == (double *)0x0) goto LAB_007fec23;
      if (out->v4rholapl3 == (double *)0x0) goto LAB_007fec28;
      if (out->v4sigma3lapl == (double *)0x0) goto LAB_007fec32;
      if (out->v4sigma2lapl2 == (double *)0x0) goto LAB_007fec3c;
      if (out->v4sigmalapl3 == (double *)0x0) goto LAB_007fec46;
      if (out->v4lapl4 != (double *)0x0) goto LAB_007fea0f;
      goto LAB_007fec50;
    }
LAB_007fea0f:
    if ((uVar2 >> 0x10 & 1) != 0) {
      if (out->v4rho3tau == (double *)0x0) goto LAB_007fec2d;
      if (out->v4rho2sigmatau == (double *)0x0) goto LAB_007fec37;
      if (out->v4rho2tau2 == (double *)0x0) goto LAB_007fec41;
      if (out->v4rhosigma2tau == (double *)0x0) goto LAB_007fec4b;
      if (out->v4rhosigmatau2 == (double *)0x0) goto LAB_007fec55;
      if (out->v4rhotau3 == (double *)0x0) goto LAB_007fec5a;
      if (out->v4sigma3tau == (double *)0x0) goto LAB_007fec64;
      if (out->v4sigma2tau2 == (double *)0x0) goto LAB_007fec6e;
      if (out->v4sigmatau3 == (double *)0x0) goto LAB_007fec78;
      if (out->v4tau4 != (double *)0x0) goto LAB_007feaa5;
      goto LAB_007fec87;
    }
LAB_007feaa5:
    if ((~uVar2 & 0x18000) != 0) {
      return;
    }
    if (out->v4rho2lapltau == (double *)0x0) goto LAB_007fec5f;
    if (out->v4rhosigmalapltau == (double *)0x0) goto LAB_007fec69;
    if (out->v4rholapl2tau == (double *)0x0) goto LAB_007fec73;
    if (out->v4rholapltau2 == (double *)0x0) goto LAB_007fec7d;
    if (out->v4sigma2lapltau == (double *)0x0) goto LAB_007fec82;
    if (out->v4sigmalapl2tau == (double *)0x0) goto LAB_007fec8c;
    if (out->v4sigmalapltau2 == (double *)0x0) goto LAB_007fec91;
    if (out->v4lapl3tau == (double *)0x0) goto LAB_007fec96;
    if (out->v4lapl2tau2 != (double *)0x0) {
      if (out->v4lapltau3 != (double *)0x0) {
        return;
      }
      goto LAB_007feca0;
    }
  }
  else {
    info = (xc_func_info_type *)(ulong)(uint)order;
    xc_mgga_sanity_check_cold_71();
LAB_007feb47:
    xc_mgga_sanity_check_cold_1();
LAB_007feb4c:
    xc_mgga_sanity_check_cold_5();
LAB_007feb51:
    xc_mgga_sanity_check_cold_4();
LAB_007feb56:
    xc_mgga_sanity_check_cold_15();
LAB_007feb5b:
    xc_mgga_sanity_check_cold_14();
LAB_007feb60:
    xc_mgga_sanity_check_cold_13();
LAB_007feb65:
    xc_mgga_sanity_check_cold_35();
LAB_007feb6a:
    xc_mgga_sanity_check_cold_34();
LAB_007feb6f:
    xc_mgga_sanity_check_cold_33();
LAB_007feb74:
    xc_mgga_sanity_check_cold_32();
LAB_007feb79:
    xc_mgga_sanity_check_cold_70();
LAB_007feb7e:
    xc_mgga_sanity_check_cold_69();
LAB_007feb83:
    xc_mgga_sanity_check_cold_68();
LAB_007feb88:
    xc_mgga_sanity_check_cold_67();
LAB_007feb8d:
    xc_mgga_sanity_check_cold_66();
LAB_007feb92:
    xc_mgga_sanity_check_cold_2();
LAB_007feb97:
    xc_mgga_sanity_check_cold_3();
LAB_007feb9c:
    xc_mgga_sanity_check_cold_8();
LAB_007feba1:
    xc_mgga_sanity_check_cold_7();
LAB_007feba6:
    xc_mgga_sanity_check_cold_11();
LAB_007febab:
    xc_mgga_sanity_check_cold_6();
LAB_007febb0:
    xc_mgga_sanity_check_cold_10();
LAB_007febb5:
    xc_mgga_sanity_check_cold_12();
LAB_007febba:
    xc_mgga_sanity_check_cold_9();
LAB_007febbf:
    xc_mgga_sanity_check_cold_21();
LAB_007febc4:
    xc_mgga_sanity_check_cold_20();
LAB_007febc9:
    xc_mgga_sanity_check_cold_19();
LAB_007febce:
    xc_mgga_sanity_check_cold_18();
LAB_007febd3:
    xc_mgga_sanity_check_cold_27();
LAB_007febd8:
    xc_mgga_sanity_check_cold_17();
LAB_007febdd:
    xc_mgga_sanity_check_cold_26();
LAB_007febe2:
    xc_mgga_sanity_check_cold_16();
LAB_007febe7:
    xc_mgga_sanity_check_cold_25();
LAB_007febec:
    xc_mgga_sanity_check_cold_24();
LAB_007febf1:
    xc_mgga_sanity_check_cold_31();
LAB_007febf6:
    xc_mgga_sanity_check_cold_23();
LAB_007febfb:
    xc_mgga_sanity_check_cold_30();
LAB_007fec00:
    xc_mgga_sanity_check_cold_22();
LAB_007fec05:
    xc_mgga_sanity_check_cold_29();
LAB_007fec0a:
    xc_mgga_sanity_check_cold_45();
LAB_007fec0f:
    xc_mgga_sanity_check_cold_28();
LAB_007fec14:
    xc_mgga_sanity_check_cold_44();
LAB_007fec19:
    xc_mgga_sanity_check_cold_43();
LAB_007fec1e:
    xc_mgga_sanity_check_cold_42();
LAB_007fec23:
    xc_mgga_sanity_check_cold_41();
LAB_007fec28:
    xc_mgga_sanity_check_cold_40();
LAB_007fec2d:
    xc_mgga_sanity_check_cold_55();
LAB_007fec32:
    xc_mgga_sanity_check_cold_39();
LAB_007fec37:
    xc_mgga_sanity_check_cold_54();
LAB_007fec3c:
    xc_mgga_sanity_check_cold_38();
LAB_007fec41:
    xc_mgga_sanity_check_cold_53();
LAB_007fec46:
    xc_mgga_sanity_check_cold_37();
LAB_007fec4b:
    xc_mgga_sanity_check_cold_52();
LAB_007fec50:
    xc_mgga_sanity_check_cold_36();
LAB_007fec55:
    xc_mgga_sanity_check_cold_51();
LAB_007fec5a:
    xc_mgga_sanity_check_cold_50();
LAB_007fec5f:
    xc_mgga_sanity_check_cold_65();
LAB_007fec64:
    xc_mgga_sanity_check_cold_49();
LAB_007fec69:
    xc_mgga_sanity_check_cold_64();
LAB_007fec6e:
    xc_mgga_sanity_check_cold_48();
LAB_007fec73:
    xc_mgga_sanity_check_cold_63();
LAB_007fec78:
    xc_mgga_sanity_check_cold_47();
LAB_007fec7d:
    xc_mgga_sanity_check_cold_62();
LAB_007fec82:
    xc_mgga_sanity_check_cold_61();
LAB_007fec87:
    xc_mgga_sanity_check_cold_46();
LAB_007fec8c:
    xc_mgga_sanity_check_cold_60();
LAB_007fec91:
    xc_mgga_sanity_check_cold_59();
LAB_007fec96:
    xc_mgga_sanity_check_cold_58();
  }
  xc_mgga_sanity_check_cold_57();
LAB_007feca0:
  xc_mgga_sanity_check_cold_56();
  if ((void *)*extraout_RDX != (void *)0x0) {
    memset((void *)*extraout_RDX,0,*(int *)&(info->ext_params).names * lVar3 * 8);
  }
  if ((void *)extraout_RDX[1] != (void *)0x0) {
    memset((void *)extraout_RDX[1],0,(long)*(int *)((long)&(info->ext_params).names + 4) * lVar3 * 8
          );
    memset((void *)extraout_RDX[2],0,(long)*(int *)&(info->ext_params).descriptions * lVar3 * 8);
    if ((*(byte *)(*(long *)info + 0x41) & 0x80) != 0) {
      memset((void *)extraout_RDX[3],0,
             *(int *)((long)&(info->ext_params).descriptions + 4) * lVar3 * 8);
    }
    if ((*(byte *)(*(long *)info + 0x42) & 1) != 0) {
      memset((void *)extraout_RDX[4],0,*(int *)&(info->ext_params).values * lVar3 * 8);
    }
  }
  if ((void *)extraout_RDX[5] != (void *)0x0) {
    lVar1 = lVar3 * 8;
    memset((void *)extraout_RDX[5],0,*(int *)((long)&(info->ext_params).values + 4) * lVar1);
    memset((void *)extraout_RDX[6],0,*(int *)&(info->ext_params).set * lVar1);
    memset((void *)extraout_RDX[9],0,*(int *)((long)&info->init + 4) * lVar1);
    if ((*(byte *)(*(long *)info + 0x41) & 0x80) != 0) {
      memset((void *)extraout_RDX[7],0,*(int *)((long)&(info->ext_params).set + 4) * lVar1);
      memset((void *)extraout_RDX[10],0,*(int *)&info->end * lVar1);
      memset((void *)extraout_RDX[0xc],0,*(int *)&info->lda * lVar1);
    }
    if ((*(byte *)(*(long *)info + 0x42) & 1) != 0) {
      memset((void *)extraout_RDX[8],0,*(int *)&info->init * lVar1);
      memset((void *)extraout_RDX[0xb],0,*(int *)((long)&info->end + 4) * lVar1);
      memset((void *)extraout_RDX[0xe],0,*(int *)&info->gga * lVar1);
    }
    if ((~*(uint *)(*(long *)info + 0x40) & 0x18000) == 0) {
      memset((void *)extraout_RDX[0xd],0,*(int *)((long)&info->lda + 4) * lVar3 * 8);
    }
  }
  if ((void *)extraout_RDX[0xf] != (void *)0x0) {
    lVar1 = lVar3 * 8;
    memset((void *)extraout_RDX[0xf],0,*(int *)((long)&info->gga + 4) * lVar1);
    memset((void *)extraout_RDX[0x10],0,*(int *)&info->mgga * lVar1);
    memset((void *)extraout_RDX[0x13],0,info[1].kind * lVar1);
    memset((void *)extraout_RDX[0x19],0,*(int *)((long)info[1].refs + 4) * lVar1);
    if ((*(byte *)(*(long *)info + 0x41) & 0x80) != 0) {
      memset((void *)extraout_RDX[0x11],0,*(int *)((long)&info->mgga + 4) * lVar1);
      memset((void *)extraout_RDX[0x14],0,*(int *)&info[1].name * lVar1);
      memset((void *)extraout_RDX[0x16],0,info[1].family * lVar1);
      memset((void *)extraout_RDX[0x1a],0,*(int *)(info[1].refs + 1) * lVar1);
      memset((void *)extraout_RDX[0x1c],0,*(int *)(info[1].refs + 2) * lVar1);
      memset((void *)extraout_RDX[0x1f],0,*(int *)((long)info[1].refs + 0x1c) * lVar1);
    }
    if ((*(byte *)(*(long *)info + 0x42) & 1) != 0) {
      memset((void *)extraout_RDX[0x12],0,info[1].number * lVar1);
      memset((void *)extraout_RDX[0x15],0,*(int *)((long)&info[1].name + 4) * lVar1);
      memset((void *)extraout_RDX[0x18],0,*(int *)info[1].refs * lVar1);
      memset((void *)extraout_RDX[0x1b],0,*(int *)((long)info[1].refs + 0xc) * lVar1);
      memset((void *)extraout_RDX[0x1e],0,*(int *)(info[1].refs + 3) * lVar1);
      memset((void *)extraout_RDX[0x22],0,info[1].flags * lVar1);
    }
    if ((~*(uint *)(*(long *)info + 0x40) & 0x18000) == 0) {
      memset((void *)extraout_RDX[0x17],0,*(int *)&info[1].field_0x14 * lVar1);
      memset((void *)extraout_RDX[0x1d],0,*(int *)((long)info[1].refs + 0x14) * lVar1);
      memset((void *)extraout_RDX[0x20],0,*(int *)(info[1].refs + 4) * lVar1);
      memset((void *)extraout_RDX[0x21],0,*(int *)((long)info[1].refs + 0x24) * lVar1);
    }
  }
  if ((void *)extraout_RDX[0x23] != (void *)0x0) {
    lVar3 = lVar3 * 8;
    memset((void *)extraout_RDX[0x23],0,*(int *)&info[1].field_0x44 * lVar3);
    memset((void *)extraout_RDX[0x24],0,*(int *)&info[1].dens_threshold * lVar3);
    memset((void *)extraout_RDX[0x27],0,*(int *)&info[1].ext_params.field_0x4 * lVar3);
    memset((void *)extraout_RDX[0x2d],0,*(int *)((long)&info[1].ext_params.values + 4) * lVar3);
    memset((void *)extraout_RDX[0x37],0,*(int *)((long)&info[1].gga + 4) * lVar3);
    if ((*(byte *)(*(long *)info + 0x41) & 0x80) != 0) {
      memset((void *)extraout_RDX[0x25],0,*(int *)((long)&info[1].dens_threshold + 4) * lVar3);
      memset((void *)extraout_RDX[0x28],0,*(int *)&info[1].ext_params.names * lVar3);
      memset((void *)extraout_RDX[0x2a],0,*(int *)&info[1].ext_params.descriptions * lVar3);
      memset((void *)extraout_RDX[0x2e],0,*(int *)&info[1].ext_params.set * lVar3);
      memset((void *)extraout_RDX[0x30],0,*(int *)&info[1].init * lVar3);
      memset((void *)extraout_RDX[0x33],0,*(int *)((long)&info[1].end + 4) * lVar3);
      memset((void *)extraout_RDX[0x38],0,*(int *)&info[1].mgga * lVar3);
      memset((void *)extraout_RDX[0x3a],0,info[2].number * lVar3);
      memset((void *)extraout_RDX[0x3d],0,*(int *)((long)&info[2].name + 4) * lVar3);
      memset((void *)extraout_RDX[0x41],0,*(int *)((long)info[2].refs + 4) * lVar3);
    }
    if ((*(byte *)(*(long *)info + 0x42) & 1) != 0) {
      memset((void *)extraout_RDX[0x26],0,info[1].ext_params.n * lVar3);
      memset((void *)extraout_RDX[0x29],0,*(int *)((long)&info[1].ext_params.names + 4) * lVar3);
      memset((void *)extraout_RDX[0x2c],0,*(int *)&info[1].ext_params.values * lVar3);
      memset((void *)extraout_RDX[0x2f],0,*(int *)((long)&info[1].ext_params.set + 4) * lVar3);
      memset((void *)extraout_RDX[0x32],0,*(int *)&info[1].end * lVar3);
      memset((void *)extraout_RDX[0x36],0,*(int *)&info[1].gga * lVar3);
      memset((void *)extraout_RDX[0x39],0,*(int *)((long)&info[1].mgga + 4) * lVar3);
      memset((void *)extraout_RDX[0x3c],0,*(int *)&info[2].name * lVar3);
      memset((void *)extraout_RDX[0x40],0,*(int *)info[2].refs * lVar3);
      memset((void *)extraout_RDX[0x45],0,*(int *)((long)info[2].refs + 0x14) * lVar3);
    }
    if ((~*(uint *)(*(long *)info + 0x40) & 0x18000) == 0) {
      memset((void *)extraout_RDX[0x2b],0,
             *(int *)((long)&info[1].ext_params.descriptions + 4) * lVar3);
      memset((void *)extraout_RDX[0x31],0,*(int *)((long)&info[1].init + 4) * lVar3);
      memset((void *)extraout_RDX[0x34],0,*(int *)&info[1].lda * lVar3);
      memset((void *)extraout_RDX[0x35],0,*(int *)((long)&info[1].lda + 4) * lVar3);
      memset((void *)extraout_RDX[0x3b],0,info[2].kind * lVar3);
      memset((void *)extraout_RDX[0x3e],0,info[2].family * lVar3);
      memset((void *)extraout_RDX[0x3f],0,*(int *)&info[2].field_0x14 * lVar3);
      memset((void *)extraout_RDX[0x42],0,*(int *)(info[2].refs + 1) * lVar3);
      memset((void *)extraout_RDX[0x43],0,*(int *)((long)info[2].refs + 0xc) * lVar3);
      memset((void *)extraout_RDX[0x44],0,*(int *)(info[2].refs + 2) * lVar3);
      return;
    }
  }
  return;
}

Assistant:

void
xc_mgga_sanity_check(const xc_func_info_type *info, int order, xc_mgga_out_params *out)
{
  /* sanity check */
  if(order < 0 || order > 4){
    fprintf(stderr, "Order of derivatives '%d' not implemented\n",
            order);
    exit(1);
  }
  
  /* sanity check */
  if(out->zk != NULL && !(info->flags & XC_FLAGS_HAVE_EXC)){
    fprintf(stderr, "Functional '%s' does not provide an implementation of Exc\n",
	    info->name);
    exit(1);
  }

  if(out->vrho != NULL){
    if(!(info->flags & XC_FLAGS_HAVE_VXC)){
      fprintf(stderr, "Functional '%s' does not provide an implementation of vxc\n",
              info->name);
      exit(1);
    }
    check_out_var(vsigma);
    if(info->flags & XC_FLAGS_NEEDS_LAPLACIAN){
      check_out_var(vlapl);
    }
    if(info->flags & XC_FLAGS_NEEDS_TAU){
      check_out_var(vtau);
    }
  }

  if(out->v2rho2 != NULL){
    if(!(info->flags & XC_FLAGS_HAVE_FXC)){
      fprintf(stderr, "Functional '%s' does not provide an implementation of fxc\n",
              info->name);
      exit(1);
    }
    check_out_var(v2rhosigma); 
    check_out_var(v2sigma2);
    if(info->flags & XC_FLAGS_NEEDS_LAPLACIAN){
      check_out_var(v2rholapl);
      check_out_var(v2sigmalapl);
      check_out_var(v2lapl2);
    }
    if(info->flags & XC_FLAGS_NEEDS_TAU){
      check_out_var(v2rhotau);
      check_out_var(v2sigmatau);
      check_out_var(v2tau2);
    }
    if((info->flags & XC_FLAGS_NEEDS_LAPLACIAN) && (info->flags & XC_FLAGS_NEEDS_TAU)){
      check_out_var(v2lapltau);
    }
  }

  if(out->v3rho3 != NULL){
    if(!(info->flags & XC_FLAGS_HAVE_KXC)){
      fprintf(stderr, "Functional '%s' does not provide an implementation of kxc\n",
              info->name);
      exit(1);
    }
    check_out_var(v3rho2sigma);
    check_out_var(v3rhosigma2);
    check_out_var(v3sigma3);
    if(info->flags & XC_FLAGS_NEEDS_LAPLACIAN){
      check_out_var(v3rho2lapl);
      check_out_var(v3rhosigmalapl);
      check_out_var(v3rholapl2);
      check_out_var(v3sigma2lapl);
      check_out_var(v3sigmalapl2);
      check_out_var(v3lapl3);
    }
    if(info->flags & XC_FLAGS_NEEDS_TAU){
      check_out_var(v3rho2tau);
      check_out_var(v3rhosigmatau);
      check_out_var(v3rhotau2);
      check_out_var(v3sigma2tau);
      check_out_var(v3sigmatau2);
      check_out_var(v3tau3);
    }
    if((info->flags & XC_FLAGS_NEEDS_LAPLACIAN) && (info->flags & XC_FLAGS_NEEDS_TAU)){
      check_out_var(v3rholapltau);
      check_out_var(v3sigmalapltau);
      check_out_var(v3lapl2tau);
      check_out_var(v3lapltau2);
    }
  }

  if(out->v4rho4 != NULL){
    if(!(info->flags & XC_FLAGS_HAVE_LXC)){
      fprintf(stderr, "Functional '%s' does not provide an implementation of lxc\n",
              info->name);
      exit(1);
    }
    check_out_var(v4rho3sigma);
    check_out_var(v4rho2sigma2);
    check_out_var(v4rhosigma3);
    check_out_var(v4sigma4);
    if(info->flags & XC_FLAGS_NEEDS_LAPLACIAN){
      check_out_var(v4rho3lapl);
      check_out_var(v4rho2sigmalapl);
      check_out_var(v4rho2lapl2);
      check_out_var(v4rhosigma2lapl);
      check_out_var(v4rhosigmalapl2);
      check_out_var(v4rholapl3);
      check_out_var(v4sigma3lapl);
      check_out_var(v4sigma2lapl2);
      check_out_var(v4sigmalapl3);
      check_out_var(v4lapl4);
    }
    if(info->flags & XC_FLAGS_NEEDS_TAU){
      check_out_var(v4rho3tau);
      check_out_var(v4rho2sigmatau);
      check_out_var(v4rho2tau2);
      check_out_var(v4rhosigma2tau);
      check_out_var(v4rhosigmatau2);
      check_out_var(v4rhotau3);
      check_out_var(v4sigma3tau);
      check_out_var(v4sigma2tau2);
      check_out_var(v4sigmatau3);
      check_out_var(v4tau4);
    }
    if((info->flags & XC_FLAGS_NEEDS_LAPLACIAN) && (info->flags & XC_FLAGS_NEEDS_TAU)){
      check_out_var(v4rho2lapltau);
      check_out_var(v4rhosigmalapltau);
      check_out_var(v4rholapl2tau);
      check_out_var(v4rholapltau2);
      check_out_var(v4sigma2lapltau);
      check_out_var(v4sigmalapl2tau);
      check_out_var(v4sigmalapltau2);
      check_out_var(v4lapl3tau);
      check_out_var(v4lapl2tau2);
      check_out_var(v4lapltau3); 
    }
  }
}